

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxdevexpr.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxDevexPR<double>::selectEnterDenseCoDim
          (SPxDevexPR<double> *this,double *best,double feastol,int start,int incr)

{
  int i;
  double *pdVar1;
  SPxSolverBase<double> *this_00;
  int in_ECX;
  int in_EDX;
  double *in_RSI;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double x;
  int enterIdx;
  int end;
  double *pen;
  double *test;
  int local_40;
  int local_24;
  DataKey local_8;
  
  SPxSolverBase<double>::test(*(SPxSolverBase<double> **)(in_RDI + 0x10));
  pdVar1 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e4037);
  this_00 = (SPxSolverBase<double> *)
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2e4054);
  i = VectorBase<double>::dim((VectorBase<double> *)0x2e4071);
  local_40 = -1;
  for (local_24 = in_EDX; local_24 < i; local_24 = in_ECX + local_24) {
    if ((pdVar1[local_24] < -in_XMM0_Qa) &&
       (dVar2 = devexpr::computePrice<double>
                          (pdVar1[local_24],
                           (double)(&(this_00->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                                     super_SVSetBase<double>.
                                     super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)
                                   [local_24],in_XMM0_Qa), *in_RSI <= dVar2 && dVar2 != *in_RSI)) {
      *in_RSI = dVar2;
      local_40 = local_24;
      *(_func_int ***)(in_RDI + 0x38) =
           (&(this_00->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
             super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray)[local_24];
    }
  }
  if (local_40 < 0) {
    SPxId::SPxId((SPxId *)0x2e4178);
  }
  else {
    local_8 = (DataKey)SPxSolverBase<double>::id(this_00,i);
  }
  return (SPxId)local_8;
}

Assistant:

SPxId SPxDevexPR<R>::selectEnterDenseCoDim(R& best, R feastol, int start, int incr)
{
   const R* test = this->thesolver->test().get_const_ptr();
   const R* pen = this->thesolver->weights.get_const_ptr();
   int end = this->thesolver->weights.dim();
   int enterIdx = -1;
   R x;

   assert(end == this->thesolver->test().dim());

   for(; start < end; start += incr)
   {
      x = test[start];

      if(test[start] < -feastol)
      {
         x = devexpr::computePrice(x, pen[start], feastol);

         if(x > best)
         {
            best = x;
            enterIdx = start;
            last = pen[start];
         }
      }
   }

   if(enterIdx >= 0)
      return this->thesolver->id(enterIdx);

   return SPxId();
}